

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O3

void av1_dist_wtd_convolve_2d_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int16_t *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [32];
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  char cVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  uint8_t *puVar44;
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined2 uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  short sVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  int16_t im_block [1120];
  undefined1 (*local_a98) [16];
  undefined1 (*local_a88) [16];
  uint8_t *local_a80;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar46 [32];
  undefined1 auVar71 [32];
  
  iVar4 = conv_params->round_0;
  iVar40 = conv_params->round_1 + iVar4;
  cVar39 = (char)iVar40;
  uVar2 = filter_params_x->taps;
  auVar57._16_16_ =
       *(undefined1 (*) [16])(filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar2);
  auVar57._0_16_ =
       *(undefined1 (*) [16])(filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar2);
  piVar6 = filter_params_y->filter_ptr;
  uVar3 = filter_params_y->taps;
  uVar36 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar3);
  uVar1 = *(undefined4 *)(piVar6 + uVar36);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._0_16_ = auVar68;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(piVar6 + uVar36 + 2);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._0_16_ = auVar45;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(piVar6 + uVar36 + 4);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(piVar6 + uVar36 + 6);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar71._16_4_ = uVar1;
  auVar71._0_16_ = auVar70;
  auVar71._20_4_ = uVar1;
  auVar71._24_4_ = uVar1;
  auVar71._28_4_ = uVar1;
  uVar34 = 0xe - iVar40;
  uVar35 = iVar4 - 1;
  sVar58 = (short)((uint)(1 << ((byte)uVar35 & 0x1f)) >> 1) + 0x2000;
  uVar48 = (undefined2)conv_params->fwd_offset;
  auVar56._2_2_ = uVar48;
  auVar56._0_2_ = uVar48;
  auVar56._4_2_ = uVar48;
  auVar56._6_2_ = uVar48;
  auVar56._8_2_ = uVar48;
  auVar56._10_2_ = uVar48;
  auVar56._12_2_ = uVar48;
  auVar56._14_2_ = uVar48;
  auVar56._16_2_ = uVar48;
  auVar56._18_2_ = uVar48;
  auVar56._20_2_ = uVar48;
  auVar56._22_2_ = uVar48;
  auVar56._24_2_ = uVar48;
  auVar56._26_2_ = uVar48;
  auVar56._28_2_ = uVar48;
  auVar56._30_2_ = uVar48;
  auVar74 = ZEXT464(uVar35);
  local_a88 = (undefined1 (*) [16])conv_params->dst;
  iVar43 = (-1 << (0x15U - (char)iVar4 & 0x1f)) + ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1);
  lVar41 = (long)conv_params->dst_stride;
  uVar48 = (undefined2)conv_params->bck_offset;
  auVar65._2_2_ = uVar48;
  auVar65._0_2_ = uVar48;
  auVar65._4_2_ = uVar48;
  auVar65._6_2_ = uVar48;
  auVar65._8_2_ = uVar48;
  auVar65._10_2_ = uVar48;
  auVar65._12_2_ = uVar48;
  auVar65._14_2_ = uVar48;
  auVar65._16_2_ = uVar48;
  auVar65._18_2_ = uVar48;
  auVar65._20_2_ = uVar48;
  auVar65._22_2_ = uVar48;
  auVar65._24_2_ = uVar48;
  auVar65._26_2_ = uVar48;
  auVar65._28_2_ = uVar48;
  auVar65._30_2_ = uVar48;
  auVar11 = vpunpcklwd_avx2(auVar56,auVar65);
  iVar4 = conv_params->do_average;
  uVar5 = conv_params->round_1;
  iVar40 = conv_params->use_dist_wtd_comp_avg;
  uVar48 = (undefined2)((1 << (0x15U - cVar39 & 0x1f)) + (1 << (0x16U - cVar39 & 0x1f)));
  auVar53._0_2_ = (undefined2)((uint)(1 << ((byte)uVar34 & 0x1f)) >> 1);
  auVar53._2_2_ = auVar53._0_2_;
  auVar53._4_2_ = auVar53._0_2_;
  auVar53._6_2_ = auVar53._0_2_;
  auVar53._8_2_ = auVar53._0_2_;
  auVar53._10_2_ = auVar53._0_2_;
  auVar53._12_2_ = auVar53._0_2_;
  auVar53._14_2_ = auVar53._0_2_;
  auVar53._16_2_ = auVar53._0_2_;
  auVar53._18_2_ = auVar53._0_2_;
  auVar53._20_2_ = auVar53._0_2_;
  auVar53._22_2_ = auVar53._0_2_;
  auVar53._24_2_ = auVar53._0_2_;
  auVar53._26_2_ = auVar53._0_2_;
  auVar53._28_2_ = auVar53._0_2_;
  auVar53._30_2_ = auVar53._0_2_;
  auVar75._2_2_ = sVar58;
  auVar75._0_2_ = sVar58;
  auVar75._4_2_ = sVar58;
  auVar75._6_2_ = sVar58;
  auVar75._8_2_ = sVar58;
  auVar75._10_2_ = sVar58;
  auVar75._12_2_ = sVar58;
  auVar75._14_2_ = sVar58;
  auVar75._16_2_ = sVar58;
  auVar75._18_2_ = sVar58;
  auVar75._20_2_ = sVar58;
  auVar75._22_2_ = sVar58;
  auVar75._24_2_ = sVar58;
  auVar75._26_2_ = sVar58;
  auVar75._28_2_ = sVar58;
  auVar75._30_2_ = sVar58;
  auVar49 = vpsraw_avx2(auVar57,1);
  auVar56 = vpshufb_avx2(auVar49,_DAT_0056f020);
  auVar57 = vpshufb_avx2(auVar49,_DAT_0056ef60);
  auVar65 = vpshufb_avx2(auVar49,_DAT_0056ef80);
  auVar49 = vpshufb_avx2(auVar49,_DAT_0056efa0);
  auVar67._4_4_ = iVar43;
  auVar67._0_4_ = iVar43;
  auVar67._8_4_ = iVar43;
  auVar67._12_4_ = iVar43;
  auVar67._16_4_ = iVar43;
  auVar67._20_4_ = iVar43;
  auVar67._24_4_ = iVar43;
  auVar67._28_4_ = iVar43;
  auVar7 = vpor_avx(auVar56._0_16_,auVar49._0_16_);
  auVar73 = ZEXT416(uVar35);
  auVar55 = ZEXT416(uVar5);
  local_a80 = dst0;
  if (auVar7._0_4_ == 0) {
    if (0 < w) {
      iVar43 = h + (uint)uVar3 + -1;
      auVar49._2_2_ = uVar48;
      auVar49._0_2_ = uVar48;
      auVar49._4_2_ = uVar48;
      auVar49._6_2_ = uVar48;
      auVar49._8_2_ = uVar48;
      auVar49._10_2_ = uVar48;
      auVar49._12_2_ = uVar48;
      auVar49._14_2_ = uVar48;
      auVar49._16_2_ = uVar48;
      auVar49._18_2_ = uVar48;
      auVar49._20_2_ = uVar48;
      auVar49._22_2_ = uVar48;
      auVar49._24_2_ = uVar48;
      auVar49._26_2_ = uVar48;
      auVar49._28_2_ = uVar48;
      auVar49._30_2_ = uVar48;
      auVar56 = vpsubw_avx2(auVar53,auVar49);
      lVar42 = (long)dst_stride0;
      uVar36 = 0;
      auVar59._16_16_ = _DAT_0051abf0;
      auVar59._0_16_ = _DAT_0051abf0;
      auVar54._16_16_ = _DAT_0051a7d0;
      auVar54._0_16_ = _DAT_0051a7d0;
      do {
        if (0 < iVar43) {
          pauVar32 = (undefined1 (*) [16])
                     (src + uVar36 + ~(long)(int)(((uVar3 >> 1) - 1) * src_stride));
          pauVar33 = (undefined1 (*) [32])local_920;
          lVar38 = 1;
          do {
            auVar61._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar32;
            auVar61._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            if (lVar38 < iVar43) {
              auVar61._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + src_stride) +
                   ZEXT116(1) * auVar61._0_16_;
              auVar61._16_16_ =
                   ZEXT116(0) * auVar61._16_16_ +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + src_stride);
            }
            pauVar32 = (undefined1 (*) [16])(*pauVar32 + src_stride * 2);
            auVar49 = vpshufb_avx2(auVar61,auVar59);
            auVar53 = vpshufb_avx2(auVar61,auVar54);
            auVar49 = vpmaddubsw_avx2(auVar49,auVar57);
            auVar53 = vpmaddubsw_avx2(auVar53,auVar65);
            auVar49 = vpaddw_avx2(auVar75,auVar49);
            auVar49 = vpaddw_avx2(auVar49,auVar53);
            auVar49 = vpsraw_avx2(auVar49,auVar74._0_16_);
            *pauVar33 = auVar49;
            pauVar33 = pauVar33 + 1;
            lVar37 = lVar38 + 1;
            lVar38 = lVar38 + 2;
          } while (lVar37 < iVar43);
        }
        if (0 < h) {
          auVar8._16_16_ = auStack_8d0;
          auVar8._0_16_ = local_8e0;
          auVar31._16_16_ = local_8c0;
          auVar31._0_16_ = auStack_8d0;
          auVar59 = vpunpckhwd_avx2(auVar8,auVar31);
          auVar9._16_16_ = auStack_8f0;
          auVar9._0_16_ = local_900;
          auVar66._16_16_ = local_8e0;
          auVar66._0_16_ = auStack_8f0;
          auVar49 = vpunpckhwd_avx2(auVar9,auVar66);
          auVar10._16_16_ = auStack_910;
          auVar10._0_16_ = local_920;
          auVar12._16_16_ = local_900;
          auVar12._0_16_ = auStack_910;
          auVar53 = vpunpckhwd_avx2(auVar10,auVar12);
          auVar54 = vpunpcklwd_avx2(auVar8,auVar31);
          auVar9 = vpunpcklwd_avx2(auVar9,auVar66);
          auVar61 = vpunpcklwd_avx2(auVar10,auVar12);
          pauVar33 = (undefined1 (*) [32])auStack_8b0;
          lVar38 = 0;
          puVar44 = local_a80;
          pauVar32 = local_a88;
          do {
            auVar8 = auVar49;
            auVar66 = auVar54;
            auVar61 = vpmaddwd_avx2(auVar61,auVar52);
            auVar54 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
            auVar12 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
            auVar49 = vpmaddwd_avx2(auVar9,auVar46);
            auVar10 = vpmaddwd_avx2(auVar66,auVar47);
            auVar49 = vpaddd_avx2(auVar10,auVar49);
            auVar10 = vpmaddwd_avx2(auVar71,auVar54);
            auVar61 = vpaddd_avx2(auVar67,auVar61);
            auVar49 = vpaddd_avx2(auVar61,auVar49);
            auVar49 = vpaddd_avx2(auVar10,auVar49);
            auVar49 = vpsrad_avx2(auVar49,auVar55);
            if ((long)uVar36 < (long)((ulong)(uint)w - 4)) {
              auVar61 = vpmaddwd_avx2(auVar52,auVar53);
              auVar53 = vpmaddwd_avx2(auVar8,auVar46);
              auVar10 = vpmaddwd_avx2(auVar59,auVar47);
              auVar53 = vpaddd_avx2(auVar10,auVar53);
              auVar10 = vpmaddwd_avx2(auVar12,auVar71);
              auVar61 = vpaddd_avx2(auVar67,auVar61);
              auVar53 = vpaddd_avx2(auVar61,auVar53);
              auVar53 = vpaddd_avx2(auVar10,auVar53);
              auVar53 = vpsrad_avx2(auVar53,auVar55);
              auVar49 = vpackssdw_avx2(auVar49,auVar53);
              auVar16._2_2_ = uVar48;
              auVar16._0_2_ = uVar48;
              auVar16._4_2_ = uVar48;
              auVar16._6_2_ = uVar48;
              auVar16._8_2_ = uVar48;
              auVar16._10_2_ = uVar48;
              auVar16._12_2_ = uVar48;
              auVar16._14_2_ = uVar48;
              auVar16._16_2_ = uVar48;
              auVar16._18_2_ = uVar48;
              auVar16._20_2_ = uVar48;
              auVar16._22_2_ = uVar48;
              auVar16._24_2_ = uVar48;
              auVar16._26_2_ = uVar48;
              auVar16._28_2_ = uVar48;
              auVar16._30_2_ = uVar48;
              auVar49 = vpaddw_avx2(auVar49,auVar16);
              if (iVar4 == 0) {
LAB_00463b40:
                *pauVar32 = auVar49._0_16_;
                *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) = auVar49._16_16_;
              }
              else {
                auVar60._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                     ZEXT116(1) * *pauVar32;
                auVar60._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
                if (iVar40 == 0) {
                  auVar49 = vpaddw_avx2(auVar49,auVar60);
                  auVar49 = vpsraw_avx2(auVar49,1);
                }
                else {
                  auVar61 = vpunpcklwd_avx2(auVar60,auVar49);
                  auVar53 = vpunpckhwd_avx2(auVar60,auVar49);
                  auVar49 = vpmaddwd_avx2(auVar11,auVar61);
                  auVar53 = vpmaddwd_avx2(auVar11,auVar53);
                  auVar61 = vpsrad_avx2(auVar49,4);
                  auVar49 = vpsrad_avx2(auVar53,4);
                  auVar49 = vpackssdw_avx2(auVar61,auVar49);
                }
                auVar49 = vpaddw_avx2(auVar49,auVar56);
                auVar49 = vpsraw_avx2(auVar49,ZEXT416(uVar34));
                auVar49 = vpackuswb_avx2(auVar49,auVar46);
                *(long *)puVar44 = auVar49._0_8_;
                *(long *)(puVar44 + lVar42) = auVar49._16_8_;
              }
            }
            else {
              auVar49 = vpackssdw_avx2(auVar49,auVar49);
              auVar17._2_2_ = uVar48;
              auVar17._0_2_ = uVar48;
              auVar17._4_2_ = uVar48;
              auVar17._6_2_ = uVar48;
              auVar17._8_2_ = uVar48;
              auVar17._10_2_ = uVar48;
              auVar17._12_2_ = uVar48;
              auVar17._14_2_ = uVar48;
              auVar17._16_2_ = uVar48;
              auVar17._18_2_ = uVar48;
              auVar17._20_2_ = uVar48;
              auVar17._22_2_ = uVar48;
              auVar17._24_2_ = uVar48;
              auVar17._26_2_ = uVar48;
              auVar17._28_2_ = uVar48;
              auVar17._30_2_ = uVar48;
              auVar49 = vpaddw_avx2(auVar49,auVar17);
              if (iVar4 == 0) goto LAB_00463b40;
              auVar62._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                   ZEXT116(1) * *pauVar32;
              auVar62._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
              if (iVar40 == 0) {
                auVar49 = vpaddw_avx2(auVar49,auVar62);
                auVar49 = vpsraw_avx2(auVar49,1);
              }
              else {
                auVar61 = vpunpcklwd_avx2(auVar62,auVar49);
                auVar53 = vpunpckhwd_avx2(auVar62,auVar49);
                auVar49 = vpmaddwd_avx2(auVar11,auVar61);
                auVar53 = vpmaddwd_avx2(auVar11,auVar53);
                auVar61 = vpsrad_avx2(auVar49,4);
                auVar49 = vpsrad_avx2(auVar53,4);
                auVar49 = vpackssdw_avx2(auVar61,auVar49);
              }
              auVar49 = vpaddw_avx2(auVar49,auVar56);
              auVar49 = vpsraw_avx2(auVar49,ZEXT416(uVar34));
              auVar49 = vpackuswb_avx2(auVar49,auVar49);
              *(int *)puVar44 = auVar49._0_4_;
              *(int *)(puVar44 + lVar42) = auVar49._16_4_;
            }
            lVar38 = lVar38 + 2;
            pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar41 * 4);
            puVar44 = puVar44 + lVar42 * 2;
            pauVar33 = pauVar33 + 1;
            auVar49 = auVar59;
            auVar59 = auVar12;
            auVar61 = auVar9;
            auVar53 = auVar8;
            auVar9 = auVar66;
          } while (lVar38 < h);
        }
        uVar36 = uVar36 + 8;
        local_a88 = local_a88 + 1;
        local_a80 = local_a80 + 8;
        auVar74 = ZEXT1664(auVar73);
        auVar59._16_16_ = _DAT_0051abf0;
        auVar59._0_16_ = _DAT_0051abf0;
        auVar54._16_16_ = _DAT_0051a7d0;
        auVar54._0_16_ = _DAT_0051a7d0;
      } while (uVar36 < (uint)w);
    }
  }
  else {
    auVar7 = vpor_avx(auVar68,auVar70);
    if (auVar7._0_4_ == 0) {
      if (0 < w) {
        auVar18._2_2_ = uVar48;
        auVar18._0_2_ = uVar48;
        auVar18._4_2_ = uVar48;
        auVar18._6_2_ = uVar48;
        auVar18._8_2_ = uVar48;
        auVar18._10_2_ = uVar48;
        auVar18._12_2_ = uVar48;
        auVar18._14_2_ = uVar48;
        auVar18._16_2_ = uVar48;
        auVar18._18_2_ = uVar48;
        auVar18._20_2_ = uVar48;
        auVar18._22_2_ = uVar48;
        auVar18._24_2_ = uVar48;
        auVar18._26_2_ = uVar48;
        auVar18._28_2_ = uVar48;
        auVar18._30_2_ = uVar48;
        auVar53 = vpsubw_avx2(auVar53,auVar18);
        lVar42 = (long)dst_stride0;
        local_a98 = (undefined1 (*) [16])(src + (1 - (ulong)(uVar2 >> 1)));
        uVar36 = 0;
        auVar72._16_16_ = _DAT_0051abf0;
        auVar72._0_16_ = _DAT_0051abf0;
        auVar76._16_16_ = _DAT_0051a7d0;
        auVar76._0_16_ = _DAT_0051a7d0;
        auVar79._16_16_ = _DAT_0051a7e0;
        auVar79._0_16_ = _DAT_0051a7e0;
        auVar69._16_16_ = _DAT_0051b630;
        auVar69._0_16_ = _DAT_0051b630;
        do {
          if (-3 < h) {
            lVar38 = -2;
            pauVar33 = (undefined1 (*) [32])local_920;
            pauVar32 = local_a98;
            do {
              lVar38 = lVar38 + 2;
              auVar51._0_16_ =
                   ZEXT116(0) * auVar45 +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pauVar32 - (long)src_stride);
              auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45
              ;
              if (lVar38 < h + 2) {
                auVar51._0_16_ = ZEXT116(0) * *pauVar32 + ZEXT116(1) * auVar51._0_16_;
                auVar51._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * *pauVar32;
              }
              auVar52 = vpshufb_avx2(auVar51,auVar72);
              auVar59 = vpshufb_avx2(auVar51,auVar76);
              auVar54 = vpshufb_avx2(auVar51,auVar79);
              auVar61 = vpshufb_avx2(auVar51,auVar69);
              auVar71 = vpmaddubsw_avx2(auVar52,auVar56);
              auVar52 = vpmaddubsw_avx2(auVar59,auVar57);
              auVar59 = vpmaddubsw_avx2(auVar54,auVar65);
              auVar52 = vpaddw_avx2(auVar52,auVar59);
              auVar59 = vpmaddubsw_avx2(auVar61,auVar49);
              auVar71 = vpaddw_avx2(auVar75,auVar71);
              auVar52 = vpaddw_avx2(auVar71,auVar52);
              auVar52 = vpaddw_avx2(auVar52,auVar59);
              auVar52 = vpsraw_avx2(auVar52,auVar73);
              *pauVar33 = auVar52;
              pauVar33 = pauVar33 + 1;
              pauVar32 = (undefined1 (*) [16])(*pauVar32 + src_stride * 2);
            } while (lVar38 <= h);
            if (0 < h) {
              auVar26._16_16_ = auStack_8f0;
              auVar26._0_16_ = local_900;
              auVar28._16_16_ = local_8e0;
              auVar28._0_16_ = auStack_8f0;
              auVar71 = vpunpckhwd_avx2(auVar26,auVar28);
              auVar22._16_16_ = auStack_910;
              auVar22._0_16_ = local_920;
              auVar24._16_16_ = local_900;
              auVar24._0_16_ = auStack_910;
              auVar52 = vpunpckhwd_avx2(auVar22,auVar24);
              auVar59 = vpunpcklwd_avx2(auVar26,auVar28);
              auVar54 = vpunpcklwd_avx2(auVar22,auVar24);
              pauVar33 = (undefined1 (*) [32])auStack_8d0;
              lVar38 = 0;
              puVar44 = local_a80;
              pauVar32 = local_a88;
              do {
                auVar61 = auVar59;
                auVar59 = vpmaddwd_avx2(auVar54,auVar46);
                auVar54 = vpmaddwd_avx2(auVar61,auVar47);
                auVar59 = vpaddd_avx2(auVar67,auVar59);
                auVar59 = vpaddd_avx2(auVar59,auVar54);
                auVar59 = vpsrad_avx2(auVar59,auVar55);
                if ((long)uVar36 < (long)((ulong)(uint)w - 4)) {
                  auVar52 = vpmaddwd_avx2(auVar52,auVar46);
                  auVar54 = vpmaddwd_avx2(auVar71,auVar47);
                  auVar52 = vpaddd_avx2(auVar67,auVar52);
                  auVar52 = vpaddd_avx2(auVar52,auVar54);
                  auVar52 = vpsrad_avx2(auVar52,auVar55);
                  auVar52 = vpackssdw_avx2(auVar59,auVar52);
                  auVar19._2_2_ = uVar48;
                  auVar19._0_2_ = uVar48;
                  auVar19._4_2_ = uVar48;
                  auVar19._6_2_ = uVar48;
                  auVar19._8_2_ = uVar48;
                  auVar19._10_2_ = uVar48;
                  auVar19._12_2_ = uVar48;
                  auVar19._14_2_ = uVar48;
                  auVar19._16_2_ = uVar48;
                  auVar19._18_2_ = uVar48;
                  auVar19._20_2_ = uVar48;
                  auVar19._22_2_ = uVar48;
                  auVar19._24_2_ = uVar48;
                  auVar19._26_2_ = uVar48;
                  auVar19._28_2_ = uVar48;
                  auVar19._30_2_ = uVar48;
                  auVar52 = vpaddw_avx2(auVar52,auVar19);
                  if (iVar4 == 0) {
LAB_00463e56:
                    *pauVar32 = auVar52._0_16_;
                    *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) = auVar52._16_16_;
                  }
                  else {
                    auVar63._0_16_ =
                         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                         ZEXT116(1) * *pauVar32;
                    auVar63._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
                    if (iVar40 == 0) {
                      auVar52 = vpaddw_avx2(auVar52,auVar63);
                      auVar52 = vpsraw_avx2(auVar52,1);
                    }
                    else {
                      auVar54 = vpunpcklwd_avx2(auVar63,auVar52);
                      auVar59 = vpunpckhwd_avx2(auVar63,auVar52);
                      auVar52 = vpmaddwd_avx2(auVar11,auVar54);
                      auVar59 = vpmaddwd_avx2(auVar11,auVar59);
                      auVar54 = vpsrad_avx2(auVar52,4);
                      auVar52 = vpsrad_avx2(auVar59,4);
                      auVar52 = vpackssdw_avx2(auVar54,auVar52);
                    }
                    auVar52 = vpaddw_avx2(auVar52,auVar53);
                    auVar52 = vpsraw_avx2(auVar52,ZEXT416(uVar34));
                    auVar52 = vpackuswb_avx2(auVar52,auVar46);
                    *(long *)puVar44 = auVar52._0_8_;
                    *(long *)(puVar44 + lVar42) = auVar52._16_8_;
                  }
                }
                else {
                  auVar52 = vpackssdw_avx2(auVar59,auVar59);
                  auVar20._2_2_ = uVar48;
                  auVar20._0_2_ = uVar48;
                  auVar20._4_2_ = uVar48;
                  auVar20._6_2_ = uVar48;
                  auVar20._8_2_ = uVar48;
                  auVar20._10_2_ = uVar48;
                  auVar20._12_2_ = uVar48;
                  auVar20._14_2_ = uVar48;
                  auVar20._16_2_ = uVar48;
                  auVar20._18_2_ = uVar48;
                  auVar20._20_2_ = uVar48;
                  auVar20._22_2_ = uVar48;
                  auVar20._24_2_ = uVar48;
                  auVar20._26_2_ = uVar48;
                  auVar20._28_2_ = uVar48;
                  auVar20._30_2_ = uVar48;
                  auVar52 = vpaddw_avx2(auVar52,auVar20);
                  if (iVar4 == 0) goto LAB_00463e56;
                  auVar64._0_16_ =
                       ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                       ZEXT116(1) * *pauVar32;
                  auVar64._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
                  if (iVar40 == 0) {
                    auVar52 = vpaddw_avx2(auVar52,auVar64);
                    auVar52 = vpsraw_avx2(auVar52,1);
                  }
                  else {
                    auVar54 = vpunpcklwd_avx2(auVar64,auVar52);
                    auVar59 = vpunpckhwd_avx2(auVar64,auVar52);
                    auVar52 = vpmaddwd_avx2(auVar11,auVar54);
                    auVar59 = vpmaddwd_avx2(auVar11,auVar59);
                    auVar54 = vpsrad_avx2(auVar52,4);
                    auVar52 = vpsrad_avx2(auVar59,4);
                    auVar52 = vpackssdw_avx2(auVar54,auVar52);
                  }
                  auVar52 = vpaddw_avx2(auVar52,auVar53);
                  auVar52 = vpsraw_avx2(auVar52,ZEXT416(uVar34));
                  auVar52 = vpackuswb_avx2(auVar52,auVar52);
                  *(int *)puVar44 = auVar52._0_4_;
                  *(int *)(puVar44 + lVar42) = auVar52._16_4_;
                }
                auVar59 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
                auVar54 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
                lVar38 = lVar38 + 2;
                pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar41 * 4);
                puVar44 = puVar44 + lVar42 * 2;
                pauVar33 = pauVar33 + 1;
                auVar52 = auVar71;
                auVar71 = auVar54;
                auVar54 = auVar61;
              } while (lVar38 < h);
            }
          }
          uVar36 = uVar36 + 8;
          local_a98 = (undefined1 (*) [16])(*local_a98 + 8);
          local_a88 = local_a88 + 1;
          local_a80 = local_a80 + 8;
        } while (uVar36 < (uint)w);
      }
    }
    else if (0 < w) {
      iVar43 = h + (uint)uVar3 + -1;
      auVar13._2_2_ = uVar48;
      auVar13._0_2_ = uVar48;
      auVar13._4_2_ = uVar48;
      auVar13._6_2_ = uVar48;
      auVar13._8_2_ = uVar48;
      auVar13._10_2_ = uVar48;
      auVar13._12_2_ = uVar48;
      auVar13._14_2_ = uVar48;
      auVar13._16_2_ = uVar48;
      auVar13._18_2_ = uVar48;
      auVar13._20_2_ = uVar48;
      auVar13._22_2_ = uVar48;
      auVar13._24_2_ = uVar48;
      auVar13._26_2_ = uVar48;
      auVar13._28_2_ = uVar48;
      auVar13._30_2_ = uVar48;
      auVar53 = vpsubw_avx2(auVar53,auVar13);
      lVar42 = (long)dst_stride0;
      uVar36 = 0;
      do {
        if (0 < iVar43) {
          pauVar32 = (undefined1 (*) [16])
                     (src + uVar36 + (-(ulong)(uVar2 >> 1) -
                                     (long)(int)(((uVar3 >> 1) - 1) * src_stride)) + 1);
          pauVar33 = (undefined1 (*) [32])local_920;
          lVar38 = 1;
          do {
            auVar50._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar32;
            auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
            if (lVar38 < iVar43) {
              auVar50._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + src_stride) +
                   ZEXT116(1) * auVar50._0_16_;
              auVar50._16_16_ =
                   ZEXT116(0) * auVar50._16_16_ +
                   ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + src_stride);
            }
            pauVar32 = (undefined1 (*) [16])(*pauVar32 + src_stride * 2);
            auVar59 = vpshufb_avx2(auVar50,_DAT_0051b5a0);
            auVar61 = vpshufb_avx2(auVar50,_DAT_0051b540);
            auVar9 = vpshufb_avx2(auVar50,_DAT_0051b560);
            auVar10 = vpshufb_avx2(auVar50,_DAT_0051b5c0);
            auVar54 = vpmaddubsw_avx2(auVar59,auVar56);
            auVar59 = vpmaddubsw_avx2(auVar61,auVar57);
            auVar61 = vpmaddubsw_avx2(auVar9,auVar65);
            auVar59 = vpaddw_avx2(auVar59,auVar61);
            auVar61 = vpmaddubsw_avx2(auVar10,auVar49);
            auVar54 = vpaddw_avx2(auVar75,auVar54);
            auVar59 = vpaddw_avx2(auVar54,auVar59);
            auVar59 = vpaddw_avx2(auVar59,auVar61);
            auVar59 = vpsraw_avx2(auVar59,auVar74._0_16_);
            *pauVar33 = auVar59;
            pauVar33 = pauVar33 + 1;
            lVar37 = lVar38 + 1;
            lVar38 = lVar38 + 2;
          } while (lVar37 < iVar43);
        }
        if (0 < h) {
          auVar29._16_16_ = auStack_8d0;
          auVar29._0_16_ = local_8e0;
          auVar30._16_16_ = local_8c0;
          auVar30._0_16_ = auStack_8d0;
          auVar59 = vpunpckhwd_avx2(auVar29,auVar30);
          auVar25._16_16_ = auStack_8f0;
          auVar25._0_16_ = local_900;
          auVar27._16_16_ = local_8e0;
          auVar27._0_16_ = auStack_8f0;
          auVar61 = vpunpckhwd_avx2(auVar25,auVar27);
          auVar21._16_16_ = auStack_910;
          auVar21._0_16_ = local_920;
          auVar23._16_16_ = local_900;
          auVar23._0_16_ = auStack_910;
          auVar54 = vpunpckhwd_avx2(auVar21,auVar23);
          auVar9 = vpunpcklwd_avx2(auVar29,auVar30);
          auVar12 = vpunpcklwd_avx2(auVar25,auVar27);
          auVar10 = vpunpcklwd_avx2(auVar21,auVar23);
          pauVar33 = (undefined1 (*) [32])auStack_8b0;
          lVar38 = 0;
          pauVar32 = local_a88;
          puVar44 = local_a80;
          do {
            auVar17 = auVar9;
            auVar31 = auVar59;
            auVar9 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
            auVar59 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar33[-1] + 0x10),*pauVar33);
            auVar66 = vpmaddwd_avx2(auVar10,auVar52);
            auVar10 = vpmaddwd_avx2(auVar12,auVar46);
            auVar8 = vpmaddwd_avx2(auVar17,auVar47);
            auVar10 = vpaddd_avx2(auVar10,auVar8);
            auVar8 = vpmaddwd_avx2(auVar71,auVar9);
            auVar66 = vpaddd_avx2(auVar67,auVar66);
            auVar10 = vpaddd_avx2(auVar10,auVar66);
            auVar10 = vpaddd_avx2(auVar8,auVar10);
            auVar10 = vpsrad_avx2(auVar10,ZEXT416(uVar5));
            if ((long)uVar36 < (long)((ulong)(uint)w - 4)) {
              auVar66 = vpmaddwd_avx2(auVar52,auVar54);
              auVar54 = vpmaddwd_avx2(auVar61,auVar46);
              auVar8 = vpmaddwd_avx2(auVar31,auVar47);
              auVar54 = vpaddd_avx2(auVar8,auVar54);
              auVar8 = vpmaddwd_avx2(auVar71,auVar59);
              auVar66 = vpaddd_avx2(auVar67,auVar66);
              auVar54 = vpaddd_avx2(auVar66,auVar54);
              auVar54 = vpaddd_avx2(auVar8,auVar54);
              auVar54 = vpsrad_avx2(auVar54,ZEXT416(uVar5));
              auVar54 = vpackssdw_avx2(auVar10,auVar54);
              auVar14._2_2_ = uVar48;
              auVar14._0_2_ = uVar48;
              auVar14._4_2_ = uVar48;
              auVar14._6_2_ = uVar48;
              auVar14._8_2_ = uVar48;
              auVar14._10_2_ = uVar48;
              auVar14._12_2_ = uVar48;
              auVar14._14_2_ = uVar48;
              auVar14._16_2_ = uVar48;
              auVar14._18_2_ = uVar48;
              auVar14._20_2_ = uVar48;
              auVar14._22_2_ = uVar48;
              auVar14._24_2_ = uVar48;
              auVar14._26_2_ = uVar48;
              auVar14._28_2_ = uVar48;
              auVar14._30_2_ = uVar48;
              auVar54 = vpaddw_avx2(auVar54,auVar14);
              if (iVar4 == 0) {
LAB_004637ec:
                *pauVar32 = auVar54._0_16_;
                *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) = auVar54._16_16_;
              }
              else {
                auVar77._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                     ZEXT116(1) * *pauVar32;
                auVar77._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
                if (iVar40 == 0) {
                  auVar54 = vpaddw_avx2(auVar77,auVar54);
                  auVar54 = vpsraw_avx2(auVar54,1);
                }
                else {
                  auVar66 = vpunpcklwd_avx2(auVar77,auVar54);
                  auVar10 = vpunpckhwd_avx2(auVar77,auVar54);
                  auVar54 = vpmaddwd_avx2(auVar11,auVar66);
                  auVar10 = vpmaddwd_avx2(auVar11,auVar10);
                  auVar66 = vpsrad_avx2(auVar54,4);
                  auVar54 = vpsrad_avx2(auVar10,4);
                  auVar54 = vpackssdw_avx2(auVar66,auVar54);
                }
                auVar54 = vpaddw_avx2(auVar54,auVar53);
                auVar54 = vpsraw_avx2(auVar54,ZEXT416(uVar34));
                auVar54 = vpackuswb_avx2(auVar54,auVar46);
                *(long *)puVar44 = auVar54._0_8_;
                *(long *)(puVar44 + lVar42) = auVar54._16_8_;
              }
            }
            else {
              auVar54 = vpackssdw_avx2(auVar10,auVar10);
              auVar15._2_2_ = uVar48;
              auVar15._0_2_ = uVar48;
              auVar15._4_2_ = uVar48;
              auVar15._6_2_ = uVar48;
              auVar15._8_2_ = uVar48;
              auVar15._10_2_ = uVar48;
              auVar15._12_2_ = uVar48;
              auVar15._14_2_ = uVar48;
              auVar15._16_2_ = uVar48;
              auVar15._18_2_ = uVar48;
              auVar15._20_2_ = uVar48;
              auVar15._22_2_ = uVar48;
              auVar15._24_2_ = uVar48;
              auVar15._26_2_ = uVar48;
              auVar15._28_2_ = uVar48;
              auVar15._30_2_ = uVar48;
              auVar54 = vpaddw_avx2(auVar54,auVar15);
              if (iVar4 == 0) goto LAB_004637ec;
              auVar78._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2) +
                   ZEXT116(1) * *pauVar32;
              auVar78._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar32 + lVar41 * 2);
              if (iVar40 == 0) {
                auVar54 = vpaddw_avx2(auVar78,auVar54);
                auVar54 = vpsraw_avx2(auVar54,1);
              }
              else {
                auVar66 = vpunpcklwd_avx2(auVar78,auVar54);
                auVar10 = vpunpckhwd_avx2(auVar78,auVar54);
                auVar54 = vpmaddwd_avx2(auVar11,auVar66);
                auVar10 = vpmaddwd_avx2(auVar11,auVar10);
                auVar66 = vpsrad_avx2(auVar54,4);
                auVar54 = vpsrad_avx2(auVar10,4);
                auVar54 = vpackssdw_avx2(auVar66,auVar54);
              }
              auVar54 = vpaddw_avx2(auVar54,auVar53);
              auVar54 = vpsraw_avx2(auVar54,ZEXT416(uVar34));
              auVar54 = vpackuswb_avx2(auVar54,auVar54);
              *(int *)puVar44 = auVar54._0_4_;
              *(int *)(puVar44 + lVar42) = auVar54._16_4_;
            }
            lVar38 = lVar38 + 2;
            pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar41 * 4);
            puVar44 = puVar44 + lVar42 * 2;
            pauVar33 = pauVar33 + 1;
            auVar54 = auVar61;
            auVar61 = auVar31;
            auVar10 = auVar12;
            auVar12 = auVar17;
          } while (lVar38 < h);
        }
        uVar36 = uVar36 + 8;
        local_a88 = local_a88 + 1;
        local_a80 = local_a80 + 8;
        auVar74 = ZEXT1664(auVar73);
      } while (uVar36 < (uint)w);
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_avx2(const uint8_t *src, int src_stride,
                                   uint8_t *dst0, int dst_stride0, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_x_qn, const int subpel_y_qn,
                                   ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);

  int im_stride = 8;
  int i, is_horiz_4tap = 0, is_vert_4tap = 0;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(conv_params->round_0 > 0);

  const __m256i round_const_h = _mm256_set1_epi16(
      ((1 << (conv_params->round_0 - 1)) >> 1) + (1 << (bd + FILTER_BITS - 2)));
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  const __m256i round_const_v = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  __m256i filt[4], coeffs_x[4], coeffs_y[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_x[0], coeffs_x[3]), 0)))
    is_horiz_4tap = 1;

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_y[0], coeffs_y[3]), 0)))
    is_vert_4tap = 1;

  if (is_horiz_4tap) {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;
    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      for (i = 0; i < im_h; i += 2) {
        __m256i data =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)src_h));
        if (i + 1 < im_h)
          data = _mm256_inserti128_si256(
              data, _mm_loadu_si128((__m128i *)(src_h + src_stride)), 1);
        src_h += (src_stride << 1);
        __m256i res = convolve_lowbd_x_4tap(data, coeffs_x + 1, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h),
                               round_shift_h);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  } else if (is_vert_4tap) {
    int im_h = h + 3;
    const int fo_vert = 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      /* Vertical filter */
      __m256i s[6];
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);

      s[3] = _mm256_unpackhi_epi16(s0, s1);
      s[4] = _mm256_unpackhi_epi16(s2, s3);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s4 =
            _mm256_loadu_si256((__m256i *)(data + 4 * im_stride));
        const __m256i s5 =
            _mm256_loadu_si256((__m256i *)(data + 5 * im_stride));

        s[2] = _mm256_unpacklo_epi16(s4, s5);
        s[5] = _mm256_unpackhi_epi16(s4, s5);

        const __m256i res_a = convolve_4tap(s, coeffs_y + 1);
        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);

        if (w - j > 4) {
          const __m256i res_b = convolve_4tap(s + 3, coeffs_y + 1);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_v), round_shift_v);
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_b_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_a_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);

          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  }
}